

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

void __thiscall
rr::MultiSampleLineRasterizer::MultiSampleLineRasterizer
          (MultiSampleLineRasterizer *this,int numSamples,IVec4 *viewport)

{
  RasterizationState local_28;
  
  this->m_numSamples = numSamples;
  local_28.winding = WINDING_CCW;
  local_28.horizontalFill = FILL_LEFT;
  local_28.verticalFill = FILL_BOTTOM;
  local_28.viewportOrientation = VIEWPORTORIENTATION_LAST;
  TriangleRasterizer::TriangleRasterizer(&this->m_triangleRasterizer0,viewport,numSamples,&local_28)
  ;
  local_28.winding = WINDING_CCW;
  local_28.horizontalFill = FILL_LEFT;
  local_28.verticalFill = FILL_BOTTOM;
  local_28.viewportOrientation = VIEWPORTORIENTATION_LAST;
  TriangleRasterizer::TriangleRasterizer
            (&this->m_triangleRasterizer1,viewport,this->m_numSamples,&local_28);
  return;
}

Assistant:

MultiSampleLineRasterizer::MultiSampleLineRasterizer (const int numSamples, const tcu::IVec4& viewport)
	: m_numSamples			(numSamples)
	, m_triangleRasterizer0 (viewport, m_numSamples, RasterizationState())
	, m_triangleRasterizer1 (viewport, m_numSamples, RasterizationState())
{
}